

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptArray.cpp
# Opt level: O0

JavascriptArray * Js::JavascriptNativeIntArray::ToVarArray(JavascriptNativeIntArray *intArray)

{
  code *pcVar1;
  bool bVar2;
  BOOL BVar3;
  uint sourceContextId;
  LocalFunctionId functionId;
  ScriptContext *pSVar4;
  ThreadContext *threadContext;
  ArrayCallSiteInfo *this;
  undefined4 *puVar5;
  FunctionBody *pFVar6;
  JavascriptArray *pJVar7;
  JavascriptFunction *pJStack_f8;
  bool foundScriptCaller;
  JavascriptFunction *caller;
  JavascriptStackWalker walker;
  ArrayCallSiteInfo *arrayInfo;
  JsReentLock reentrancylock;
  JavascriptNativeIntArray *intArray_local;
  
  reentrancylock._24_8_ = intArray;
  pSVar4 = RecyclableObject::GetScriptContext((RecyclableObject *)intArray);
  threadContext = ScriptContext::GetThreadContext(pSVar4);
  JsReentLock::JsReentLock((JsReentLock *)&arrayInfo,threadContext);
  this = JavascriptNativeArray::GetArrayCallSiteInfo((JavascriptNativeArray *)reentrancylock._24_8_)
  ;
  if (this != (ArrayCallSiteInfo *)0x0) {
    pSVar4 = RecyclableObject::GetScriptContext((RecyclableObject *)reentrancylock._24_8_);
    JavascriptStackWalker::JavascriptStackWalker
              ((JavascriptStackWalker *)&caller,pSVar4,true,(PVOID)0x0,false);
    pJStack_f8 = (JavascriptFunction *)0x0;
    bVar2 = false;
    do {
      BVar3 = JavascriptStackWalker::GetCaller
                        ((JavascriptStackWalker *)&caller,&stack0xffffffffffffff08,true);
      if (BVar3 == 0) goto LAB_010c5c38;
    } while ((pJStack_f8 == (JavascriptFunction *)0x0) ||
            (BVar3 = ScriptFunction::Test(pJStack_f8), BVar3 == 0));
    bVar2 = true;
LAB_010c5c38:
    if (bVar2) {
      if (pJStack_f8 == (JavascriptFunction *)0x0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar5 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                    ,0x854,"(caller)","caller");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar5 = 0;
      }
      pFVar6 = JavascriptFunction::GetFunctionBody(pJStack_f8);
      if (pFVar6 == (FunctionBody *)0x0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar5 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                    ,0x855,"(caller->GetFunctionBody())","caller->GetFunctionBody()"
                                   );
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar5 = 0;
      }
      pFVar6 = JavascriptFunction::GetFunctionBody(pJStack_f8);
      sourceContextId = FunctionProxy::GetSourceContextId((FunctionProxy *)pFVar6);
      pFVar6 = JavascriptFunction::GetFunctionBody(pJStack_f8);
      functionId = FunctionProxy::GetLocalFunctionId((FunctionProxy *)pFVar6);
      bVar2 = Phases::IsEnabled((Phases *)&DAT_01ec1678,NativeArrayConversionPhase,sourceContextId,
                                functionId);
      if (bVar2) {
        Output::Print(L"Conversion: Int array to Var array    ArrayCreationFunctionNumber:%2d    CallSiteNumber:%2d \n"
                      ,(ulong)this->functionNumber,(ulong)this->callSiteNumber);
        Output::Flush();
      }
    }
    else {
      bVar2 = Phases::IsEnabled((Phases *)&DAT_01ec1678,NativeArrayConversionPhase);
      if (bVar2) {
        Output::Print(L"Conversion: Int array to Var array across ScriptContexts");
        Output::Flush();
      }
    }
    ArrayCallSiteInfo::SetIsNotNativeArray(this);
    JavascriptStackWalker::~JavascriptStackWalker((JavascriptStackWalker *)&caller);
  }
  JavascriptNativeArray::ClearArrayCallSiteIndex((JavascriptNativeArray *)reentrancylock._24_8_);
  pJVar7 = ConvertToVarArray((JavascriptNativeIntArray *)reentrancylock._24_8_);
  JsReentLock::~JsReentLock((JsReentLock *)&arrayInfo);
  return pJVar7;
}

Assistant:

JavascriptArray *JavascriptNativeIntArray::ToVarArray(JavascriptNativeIntArray *intArray)
    {
        JIT_HELPER_NOT_REENTRANT_HEADER(IntArr_ToVarArray, reentrancylock, intArray->GetScriptContext()->GetThreadContext());
#if ENABLE_PROFILE_INFO
        ArrayCallSiteInfo *arrayInfo = intArray->GetArrayCallSiteInfo();
        if (arrayInfo)
        {
#if DBG
            Js::JavascriptStackWalker walker(intArray->GetScriptContext());
            Js::JavascriptFunction* caller = nullptr;
            bool foundScriptCaller = false;
            while(walker.GetCaller(&caller))
            {
                if(caller != nullptr && Js::ScriptFunction::Test(caller))
                {
                    foundScriptCaller = true;
                    break;
                }
            }

            if(foundScriptCaller)
            {
                Assert(caller);
                Assert(caller->GetFunctionBody());
                if(PHASE_TRACE(Js::NativeArrayConversionPhase, caller->GetFunctionBody()))
                {
                    Output::Print(_u("Conversion: Int array to Var array    ArrayCreationFunctionNumber:%2d    CallSiteNumber:%2d \n"), arrayInfo->functionNumber, arrayInfo->callSiteNumber);
                    Output::Flush();
                }
            }
            else
            {
                if(PHASE_TRACE1(Js::NativeArrayConversionPhase))
                {
                    Output::Print(_u("Conversion: Int array to Var array across ScriptContexts"));
                    Output::Flush();
                }
            }
#else
            if(PHASE_TRACE1(Js::NativeArrayConversionPhase))
            {
                Output::Print(_u("Conversion: Int array to Var array"));
                Output::Flush();
            }
#endif

            arrayInfo->SetIsNotNativeArray();
        }
#endif

        intArray->ClearArrayCallSiteIndex();

        return ConvertToVarArray(intArray);
        JIT_HELPER_END(IntArr_ToVarArray);
    }